

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  undefined2 uVar2;
  void *pvVar3;
  long lVar4;
  char *pcVar5;
  UConverterSharedData *source;
  byte *pbVar6;
  UErrorCode UVar7;
  int iVar8;
  int32_t *offsets;
  int *piVar9;
  char acVar10 [2];
  char cVar11;
  int8_t iVar12;
  UChar *pUVar13;
  int iVar14;
  long lVar15;
  UConverter *pUVar16;
  uint uVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *local_88;
  int local_7c;
  UConverterSharedData *local_78;
  ulong local_70;
  char tempBuf [2];
  UChar *local_48;
  int32_t *local_38;
  
  pbVar18 = (byte *)args->source;
  pUVar16 = args->converter;
  pbVar19 = (byte *)args->sourceLimit;
  pvVar3 = pUVar16->extraInfo;
  local_88 = pbVar18;
  if (*(int *)((long)pvVar3 + 0x6c) == 1) {
    local_78 = (UConverterSharedData *)&args->source;
    uVar2 = args->size;
    acVar10[0] = '8';
    acVar10[1] = '\0';
    if ((ushort)uVar2 < 0x38) {
      acVar10 = (char  [2])uVar2;
    }
    memcpy(tempBuf,args,(ulong)(ushort)acVar10);
    source = local_78;
    lVar4 = *(long *)((long)pvVar3 + 0x50);
    tempBuf = acVar10;
    if (*(int *)((long)pvVar3 + 0x68) != 0) goto LAB_002f507f;
    while (UVar7 = *err, UVar7 < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar5 = args->source;
      if (args->sourceLimit <= pcVar5) {
        return;
      }
      for (lVar15 = 0; (pcVar5 + lVar15 < args->sourceLimit && (pcVar5[lVar15] != '\x1b'));
          lVar15 = lVar15 + 1) {
      }
      if (lVar15 != 0) {
        cVar11 = args->converter->toULength;
        if (0 < (long)cVar11) {
          memcpy((void *)(lVar4 + 0x41),args->converter->toUBytes,(long)cVar11);
          cVar11 = args->converter->toULength;
        }
        *(char *)(lVar4 + 0x40) = cVar11;
        ucnv_MBCSToUnicodeWithOffsets_63((UConverterToUnicodeArgs *)tempBuf,err);
        piVar9 = args->offsets;
        if ((piVar9 != (int *)0x0) && (pbVar19 = *(byte **)source, pbVar18 != pbVar19)) {
          for (pUVar13 = args->target; pUVar13 < local_48; pUVar13 = pUVar13 + 1) {
            if (-1 < *piVar9) {
              *piVar9 = *piVar9 + ((int)pbVar19 - (int)pbVar18);
            }
            piVar9 = piVar9 + 1;
          }
        }
        args->source = pcVar5;
        args->target = local_48;
        args->offsets = local_38;
        cVar11 = *(char *)(lVar4 + 0x40);
        if (0 < (long)cVar11) {
          memcpy(args->converter->toUBytes,(void *)(lVar4 + 0x41),(long)cVar11);
          cVar11 = *(char *)(lVar4 + 0x40);
        }
        pUVar16 = args->converter;
        pUVar16->toULength = cVar11;
        UVar7 = *err;
        if (UVar7 == U_BUFFER_OVERFLOW_ERROR) {
          cVar11 = *(char *)(lVar4 + 0x5d);
          UVar7 = U_BUFFER_OVERFLOW_ERROR;
          if (0 < (long)cVar11) {
            memcpy(pUVar16->UCharErrorBuffer,(void *)(lVar4 + 0x90),(long)cVar11);
            cVar11 = *(char *)(lVar4 + 0x5d);
            pUVar16 = args->converter;
            UVar7 = *err;
          }
          pUVar16->UCharErrorBufferLength = cVar11;
          *(undefined1 *)(lVar4 + 0x5d) = 0;
        }
      }
      if (U_ZERO_ERROR < UVar7) {
        return;
      }
      pbVar19 = (byte *)args->sourceLimit;
      if ((byte *)args->source == pbVar19) {
        return;
      }
      pUVar16 = args->converter;
LAB_002f507f:
      changeState_2022(pUVar16,(char **)source,(char *)pbVar19,ISO_2022_KR,err);
    }
  }
  else {
    pUVar13 = args->target;
    local_78 = *(UConverterSharedData **)(*(long *)((long)pvVar3 + 0x50) + 0x30);
    local_7c = (int)pUVar16->useFallback;
    if (*(int *)((long)pvVar3 + 0x68) != 0) goto LAB_002f510b;
    if (pbVar19 <= pbVar18 || pUVar16->toULength != '\x01') goto LAB_002f509a;
    if (args->targetLimit <= pUVar13) goto LAB_002f509a;
    uVar17 = (uint)pUVar16->toUBytes[0];
    pUVar16->toULength = '\0';
    do {
      bVar1 = *pbVar18;
      local_70 = (ulong)bVar1;
      if ((((short)uVar17 + 0xdfU & 0xfe) < 0x5e) && ((byte)(bVar1 - 0x21) < 0x5e)) {
        local_88 = pbVar18 + 1;
        tempBuf = (char  [2])(CONCAT11(bVar1,(char)uVar17 + -0x80) | 0x8000);
        iVar8 = ucnv_MBCSSimpleGetNextUChar_63(local_78,tempBuf,2,(UBool)local_7c);
        uVar17 = uVar17 * 0x100 + (int)local_70;
LAB_002f51f3:
        pbVar18 = pbVar18 + 1;
        pbVar6 = local_88;
      }
      else {
        iVar8 = 0xffff;
        pbVar6 = pbVar18;
        if ((0x5d < (byte)(bVar1 - 0x21)) &&
           ((0x1f < bVar1 || ((0x800c000U >> (bVar1 & 0x1f) & 1) == 0)))) {
          local_88 = pbVar18 + 1;
          uVar17 = uVar17 << 8 | (uint)bVar1;
          goto LAB_002f51f3;
        }
      }
      while( true ) {
        local_88 = pbVar6;
        if (0xfffd < iVar8) {
          pUVar16 = args->converter;
          iVar12 = '\x01';
          if (0xff < (ushort)uVar17) {
            pUVar16->toUBytes[1] = (uint8_t)uVar17;
            uVar17 = (uVar17 & 0xffff) >> 8;
            iVar12 = '\x02';
          }
          pUVar16->toUBytes[0] = (uint8_t)uVar17;
          pUVar16->toULength = iVar12;
          *err = (uint)(iVar8 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
          goto LAB_002f50e6;
        }
        if (args->offsets != (int32_t *)0x0) {
          iVar14 = -1;
          if (0xff < (ushort)uVar17) {
            iVar14 = -2;
          }
          *(int *)((long)args->offsets + ((long)pUVar13 - (long)args->target) * 2) =
               ((int)pbVar18 + iVar14) - *(int *)&args->source;
        }
        *pUVar13 = (UChar)iVar8;
        pUVar13 = pUVar13 + 1;
LAB_002f509a:
        while( true ) {
          while( true ) {
            while( true ) {
              local_88 = pbVar18;
              if (pbVar19 <= local_88) goto LAB_002f50e6;
              if (args->targetLimit <= pUVar13) {
                *err = U_BUFFER_OVERFLOW_ERROR;
                goto LAB_002f50e6;
              }
              bVar1 = *local_88;
              uVar17 = (uint)bVar1;
              pbVar18 = local_88 + 1;
              if (bVar1 != 0xe) break;
              *(undefined1 *)((long)pvVar3 + 0x60) = 1;
              *(undefined1 *)((long)pvVar3 + 0x70) = 1;
            }
            if (bVar1 != 0xf) break;
            *(undefined1 *)((long)pvVar3 + 0x60) = 0;
            if (*(char *)((long)pvVar3 + 0x70) != '\0') {
              *(undefined1 *)((long)pvVar3 + 0x70) = 0;
              *err = U_ILLEGAL_ESCAPE_SEQUENCE;
              pUVar16 = args->converter;
              pUVar16->toUCallbackReason = UCNV_IRREGULAR;
              pUVar16->toUBytes[0] = '\x0f';
              args->converter->toULength = '\x01';
              args->target = pUVar13;
              args->source = (char *)(local_88 + 1);
              return;
            }
          }
          if (bVar1 != 0x1b) break;
          pUVar16 = args->converter;
LAB_002f510b:
          *(undefined1 *)((long)pvVar3 + 0x70) = 0;
          changeState_2022(pUVar16,(char **)&local_88,(char *)pbVar19,ISO_2022_KR,err);
          pbVar18 = local_88;
          if (U_ZERO_ERROR < *err) goto LAB_002f50e6;
        }
        pbVar18 = local_88 + 1;
        *(undefined1 *)((long)pvVar3 + 0x70) = 0;
        if (*(char *)((long)pvVar3 + 0x60) == '\x01') break;
        iVar8 = 0xffff;
        pbVar6 = pbVar18;
        if (-1 < (char)bVar1) {
          pbVar6 = local_88;
          local_88 = pbVar18;
          iVar8 = ucnv_MBCSSimpleGetNextUChar_63(local_78,(char *)pbVar6,1,(UBool)local_7c);
          pbVar6 = local_88;
        }
      }
    } while (pbVar18 < pbVar19);
    args->converter->toUBytes[0] = bVar1;
    args->converter->toULength = '\x01';
    local_88 = pbVar18;
LAB_002f50e6:
    args->target = pUVar13;
    args->source = (char *)local_88;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    UChar mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    UConverterSharedData* sharedData ;
    UBool useFallback;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    if(myData->version==1){
        UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize state */
    sharedData = myData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        goto getTrailByte;
    }

    while(mySource< mySourceLimit){

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            if(mySourceChar==UCNV_SI){
                myData->toU2022State.g = 0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                /*consume the source */
                continue;
            }else if(mySourceChar==UCNV_SO){
                myData->toU2022State.g = 1;
                myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                /*consume the source */
                continue;
            }else if(mySourceChar==ESC_2022){
                mySource--;
escape:
                myData->isEmptySegment = FALSE;	/* Any invalid ESC sequences will be detected separately, so just reset this */
                changeState_2022(args->converter,&(mySource),
                                mySourceLimit, ISO_2022_KR, err);
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;
            }

            myData->isEmptySegment = FALSE;	/* Any invalid char errors will be detected separately, so just reset this */
            if(myData->toU2022State.g == 1) {
                if(mySource < mySourceLimit) {
                    int leadIsOk, trailIsOk;
                    uint8_t trailByte;
getTrailByte:
                    targetUniChar = missingCharMarker;
                    trailByte = (uint8_t)*mySource;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                     * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        ++mySource;
                        tempBuf[0] = (char)(mySourceChar + 0x80);
                        tempBuf[1] = (char)(trailByte + 0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, tempBuf, 2, useFallback);
                        mySourceChar = (mySourceChar << 8) | trailByte;
                    } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        ++mySource;
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar = static_cast<UChar>(0x10000 | (mySourceChar << 8) | trailByte);
                    }
                } else {
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    break;
                }
            }
            else if(mySourceChar <= 0x7f) {
                targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, mySource - 1, 1, useFallback);
            } else {
                targetUniChar = 0xffff;
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else {
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    args->target = myTarget;
    args->source = mySource;
}